

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ModportExplicitPortSyntax *pMVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  SyntaxNode *local_20;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x48) == (SyntaxNode *)0x0) {
    local_20 = (SyntaxNode *)0x0;
  }
  else {
    local_20 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x48),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModportExplicitPortSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,&local_60,
                      (ExpressionSyntax **)&local_20,&local_30);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModportExplicitPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModportExplicitPortSyntax>(
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}